

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall QKmsDevice::~QKmsDevice(QKmsDevice *this)

{
  QKmsDevice *in_RDI;
  
  in_RDI->_vptr_QKmsDevice = (_func_int **)&PTR__QKmsDevice_001a8d30;
  threadLocalAtomicReset(in_RDI);
  QList<QKmsPlane>::~QList((QList<QKmsPlane> *)0x164a68);
  QThreadStorage<QKmsDevice::AtomicReqs>::~QThreadStorage
            ((QThreadStorage<QKmsDevice::AtomicReqs> *)0x164a76);
  QString::~QString((QString *)0x164a84);
  return;
}

Assistant:

QKmsDevice::~QKmsDevice()
{
#if QT_CONFIG(drm_atomic)
    threadLocalAtomicReset();
#endif
}